

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_std.h
# Opt level: O3

void __thiscall Person::~Person(Person *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->_last)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_last).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_first)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_first).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

bool operator==(const Person &o) const
    { 
        return _first == o._first && _last == o._last && _age == o._age; 
    }